

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

uint8_t string_to_bcd_a(char *number_string,uint8_t *buffer,uint8_t buff_len)

{
  size_t sVar1;
  byte local_1a;
  uint8_t i;
  uint8_t buff_len_local;
  uint8_t *buffer_local;
  char *number_string_local;
  
  memset(buffer,0,(ulong)buff_len);
  for (local_1a = 0; sVar1 = strnlen(number_string,((ulong)buff_len & 0x7f) << 1), local_1a < sVar1;
      local_1a = local_1a + 1) {
    if ((uint)local_1a % 2 == 0) {
      if (number_string[local_1a] == '0') {
        buffer[(int)(uint)local_1a >> 1] = 0xa0;
      }
      else {
        buffer[(int)(uint)local_1a >> 1] = number_string[local_1a] * '\x10';
      }
    }
    else if (number_string[local_1a] == '0') {
      buffer[(int)(uint)local_1a >> 1] = buffer[(int)(uint)local_1a >> 1] | 10;
    }
    else {
      buffer[(int)(uint)local_1a >> 1] =
           buffer[(int)(uint)local_1a >> 1] | number_string[local_1a] - 0x30U;
    }
  }
  return local_1a;
}

Assistant:

extern uint8_t string_to_bcd_a(char *number_string, uint8_t *buffer, uint8_t buff_len) {
    uint8_t i;

    memset(buffer, 0, buff_len);

    for (i = 0; i < (strnlen(number_string, (uint8_t)(buff_len * 2))); i++) {
        if (i % 2 == 0) {
            if (number_string[i] == '0') {
                buffer[(i >> 1)] = 0xa0;
            } else {
                buffer[(i >> 1)] = (number_string[i] - '0') << 4;
            }
        } else {
            if (number_string[i] == '0') {
                buffer[(i >> 1)] |= 0x0a;
            } else {
                buffer[(i >> 1)] |= (number_string[i] - '0');
            }
        }
    }

    return i;
}